

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

MSLResourceBinding * __thiscall
spirv_cross::CompilerMSL::get_argument_buffer_resource
          (CompilerMSL *this,uint32_t desc_set,uint32_t arg_idx)

{
  ExecutionModel EVar1;
  bool bVar2;
  SPIREntryPoint *pSVar3;
  pointer pvVar4;
  pointer pvVar5;
  CompilerError *this_00;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  local_58;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
  local_50;
  const_iterator bind_itr;
  StageSetBinding bind_tuple;
  _Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_true> local_30;
  const_iterator arg_itr;
  StageSetBinding arg_idx_tuple;
  ExecutionModel stage;
  uint32_t arg_idx_local;
  uint32_t desc_set_local;
  CompilerMSL *this_local;
  
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  EVar1 = pSVar3->model;
  arg_itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_true>.
  _M_cur._0_4_ = EVar1;
  arg_itr.
  super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_true>.
  _M_cur._4_4_ = desc_set;
  local_30._M_cur =
       (__node_type *)
       ::std::
       unordered_map<spirv_cross::StageSetBinding,_unsigned_int,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>_>_>
       ::find(&this->resource_arg_buff_idx_to_binding_number,(key_type *)&arg_itr);
  bind_tuple._4_8_ =
       ::std::
       end<std::unordered_map<spirv_cross::StageSetBinding,unsigned_int,spirv_cross::InternalHasher,std::equal_to<spirv_cross::StageSetBinding>,std::allocator<std::pair<spirv_cross::StageSetBinding_const,unsigned_int>>>>
                 (&this->resource_arg_buff_idx_to_binding_number);
  bVar2 = ::std::__detail::operator!=
                    (&local_30,
                     (_Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_true>
                      *)&bind_tuple.desc_set);
  if (bVar2) {
    bind_itr.
    super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
    ._M_cur._4_4_ = EVar1;
    pvVar4 = ::std::__detail::
             _Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_unsigned_int>,_false,_true>
                           *)&local_30);
    bind_tuple.model = pvVar4->second;
    local_50._M_cur =
         (__node_type *)
         ::std::
         unordered_map<spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>,_spirv_cross::InternalHasher,_std::equal_to<spirv_cross::StageSetBinding>,_std::allocator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>_>_>
         ::find(&this->resource_bindings,
                (key_type *)
                ((long)&bind_itr.
                        super__Node_iterator_base<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_true>
                        ._M_cur + 4));
    local_58._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_map<spirv_cross::StageSetBinding,std::pair<spirv_cross::MSLResourceBinding,bool>,spirv_cross::InternalHasher,std::equal_to<spirv_cross::StageSetBinding>,std::allocator<std::pair<spirv_cross::StageSetBinding_const,std::pair<spirv_cross::MSLResourceBinding,bool>>>>>
                   (&this->resource_bindings);
    bVar2 = ::std::__detail::operator!=(&local_50,&local_58);
    if (bVar2) {
      pvVar5 = ::std::__detail::
               _Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_spirv_cross::StageSetBinding,_std::pair<spirv_cross::MSLResourceBinding,_bool>_>,_false,_true>
                             *)&local_50);
      return &(pvVar5->second).first;
    }
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError
            (this_00,
             "Argument buffer resource base type could not be determined. When padding argument buffer elements, all descriptor set resources must be supplied with a base type by the app."
            );
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

const MSLResourceBinding &CompilerMSL::get_argument_buffer_resource(uint32_t desc_set, uint32_t arg_idx) const
{
	auto stage = get_entry_point().model;
	StageSetBinding arg_idx_tuple = { stage, desc_set, arg_idx };
	auto arg_itr = resource_arg_buff_idx_to_binding_number.find(arg_idx_tuple);
	if (arg_itr != end(resource_arg_buff_idx_to_binding_number))
	{
		StageSetBinding bind_tuple = { stage, desc_set, arg_itr->second };
		auto bind_itr = resource_bindings.find(bind_tuple);
		if (bind_itr != end(resource_bindings))
			return bind_itr->second.first;
	}
	SPIRV_CROSS_THROW("Argument buffer resource base type could not be determined. When padding argument buffer "
	                  "elements, all descriptor set resources must be supplied with a base type by the app.");
}